

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O3

void DoRemap(WebPIDecoder *idec,ptrdiff_t offset)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  uint32_t p;
  uint uVar6;
  ulong uVar7;
  uint8_t *puVar8;
  
  pvVar2 = idec->dec;
  sVar4 = (idec->mem).start;
  puVar8 = (idec->mem).buf + sVar4;
  (idec->io).data = puVar8;
  sVar4 = (idec->mem).end - sVar4;
  (idec->io).data_size = sVar4;
  if (pvVar2 != (void *)0x0) {
    if (idec->is_lossless != 0) {
LAB_001083ff:
      VP8LBitReaderSetBuffer((VP8LBitReader *)((long)pvVar2 + 0x28),puVar8,sVar4);
      return;
    }
    uVar1 = *(uint *)((long)pvVar2 + 0x1b0);
    if (offset != 0) {
      uVar7 = 0;
      do {
        VP8RemapBitReader((VP8BitReader *)((long)pvVar2 + uVar7 * 0x30 + 0x1b8),offset);
        uVar6 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar6;
      } while (uVar6 <= uVar1);
      if ((idec->mem).mode == MEM_MODE_MAP) {
        VP8RemapBitReader((VP8BitReader *)((long)pvVar2 + 0x10),offset);
      }
    }
    puVar8 = *(uint8_t **)((long)pvVar2 + (ulong)uVar1 * 0x30 + 0x1c8);
    VP8BitReaderSetBuffer
              ((VP8BitReader *)((long)pvVar2 + (ulong)uVar1 * 0x30 + 0x1b8),puVar8,
               (size_t)((idec->mem).buf + ((idec->mem).end - (long)puVar8)));
    if ((((idec->state != STATE_WEBP_HEADER) && (idec->is_lossless == 0)) &&
        (*(long *)((long)idec->dec + 0xb98) != 0)) && (*(int *)((long)idec->dec + 0xba8) == 0)) {
      lVar3 = *(long *)((long)pvVar2 + 0xb90);
      lVar5 = offset + *(long *)((long)pvVar2 + 0xb98);
      *(long *)((long)pvVar2 + 0xb98) = lVar5;
      if (((lVar3 != 0) && (*(void **)(lVar3 + 0x18) != (void *)0x0)) && (*(int *)(lVar3 + 8) == 1))
      {
        puVar8 = (uint8_t *)(lVar5 + 1);
        sVar4 = *(long *)((long)pvVar2 + 0xba0) - 1;
        pvVar2 = *(void **)(lVar3 + 0x18);
        goto LAB_001083ff;
      }
    }
  }
  return;
}

Assistant:

static void DoRemap(WebPIDecoder* const idec, ptrdiff_t offset) {
  MemBuffer* const mem = &idec->mem;
  const uint8_t* const new_base = mem->buf + mem->start;
  // note: for VP8, setting up idec->io is only really needed at the beginning
  // of the decoding, till partition #0 is complete.
  idec->io.data = new_base;
  idec->io.data_size = MemDataSize(mem);

  if (idec->dec != NULL) {
    if (!idec->is_lossless) {
      VP8Decoder* const dec = (VP8Decoder*)idec->dec;
      const uint32_t last_part = dec->num_parts_minus_one;
      if (offset != 0) {
        uint32_t p;
        for (p = 0; p <= last_part; ++p) {
          VP8RemapBitReader(dec->parts + p, offset);
        }
        // Remap partition #0 data pointer to new offset, but only in MAP
        // mode (in APPEND mode, partition #0 is copied into a fixed memory).
        if (mem->mode == MEM_MODE_MAP) {
          VP8RemapBitReader(&dec->br, offset);
        }
      }
      {
        const uint8_t* const last_start = dec->parts[last_part].buf;
        VP8BitReaderSetBuffer(&dec->parts[last_part], last_start,
                              mem->buf + mem->end - last_start);
      }
      if (NeedCompressedAlpha(idec)) {
        ALPHDecoder* const alph_dec = dec->alph_dec;
        dec->alpha_data += offset;
        if (alph_dec != NULL && alph_dec->vp8l_dec != NULL) {
          if (alph_dec->method == ALPHA_LOSSLESS_COMPRESSION) {
            VP8LDecoder* const alph_vp8l_dec = alph_dec->vp8l_dec;
            assert(dec->alpha_data_size >= ALPHA_HEADER_LEN);
            VP8LBitReaderSetBuffer(&alph_vp8l_dec->br,
                                   dec->alpha_data + ALPHA_HEADER_LEN,
                                   dec->alpha_data_size - ALPHA_HEADER_LEN);
          } else {  // alph_dec->method == ALPHA_NO_COMPRESSION
            // Nothing special to do in this case.
          }
        }
      }
    } else {    // Resize lossless bitreader
      VP8LDecoder* const dec = (VP8LDecoder*)idec->dec;
      VP8LBitReaderSetBuffer(&dec->br, new_base, MemDataSize(mem));
    }
  }
}